

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase232::run(TestCase232 *this)

{
  uint uVar1;
  Bounded<64UL,_int> local_34;
  Bounded<123ul,unsigned_char> local_2d;
  Bounded<15UL,_int> local_2c;
  Bounded<16ul,unsigned_char> local_27 [7];
  Bounded<123ul,unsigned_char> local_20;
  Bounded<16UL,_unsigned_char> bar;
  bool local_1c;
  Bounded<123UL,_unsigned_char> foo;
  Bounded<123UL,_unsigned_char> succ3;
  Bounded<123UL,_unsigned_char> succ2;
  Bounded<123UL,_unsigned_char> succ1;
  bool _kj_shouldLog;
  TestCase232 *local_10;
  TestCase232 *this_local;
  
  local_10 = this;
  _foo = (anonymous_namespace)::boundedValue<456u,unsigned_int>(0x1c8);
  bounded<123u>();
  __kj_shouldLog =
       Bounded<456UL,_unsigned_int>::
       subtractChecked<123U,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_units_test_c__:237:3)>
                 ((Bounded<456UL,_unsigned_int> *)&foo);
  uVar1 = Bounded<333UL,_unsigned_int>::unwrap((Bounded<333UL,_unsigned_int> *)&_kj_shouldLog);
  if (uVar1 != 0x14d) {
    local_1c = _::Debug::shouldLog(ERROR);
    while (local_1c != false) {
      _::Debug::log<char_const(&)[99]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/units-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"boundedValue<456>().subtractChecked(bounded<123>(), [](){}).unwrap() == 456 - 123\""
                 ,(char (*) [99])
                  "failed: expected boundedValue<456>().subtractChecked(bounded<123>(), [](){}).unwrap() == 456 - 123"
                );
      local_1c = false;
    }
  }
  memset(&bar,0,1);
  bounded<123u>();
  Bounded<123ul,unsigned_char>::operator=(&local_20);
  bounded<122u>();
  Bounded<123ul,unsigned_char>::operator=(&local_20);
  bounded<0u>();
  Bounded<123ul,unsigned_char>::operator=(&local_20);
  local_2d = local_20;
  bounded<3u>();
  local_2c = operator>><123UL,_3U,_unsigned_char>(local_2d);
  Bounded<16ul,unsigned_char>::operator=(local_27,&local_2c);
  bounded<2u>();
  local_34 = Bounded<(boundedLShift<16ul,2u>)(),decltype(((unsigned_char)())<<((unsigned_int)()))>kj
             ::operator<<(local_27[0]);
  Bounded<123ul,unsigned_char>::operator=(&local_20,&local_34);
  return;
}

Assistant:

TEST(UnitMeasure, BoundedVsGuardedConst) {
  // TODO(someday): Some script should attempt to compile this test once with each "COMPILE ERROR"
  //   line restored to verify that they actually error out.

  KJ_EXPECT((boundedValue<456>() + bounded<123>()).unwrap() == 456 + 123);
  KJ_EXPECT(boundedValue<456>().subtractChecked(bounded<123>(), [](){}).unwrap() == 456 - 123);
  KJ_EXPECT((boundedValue<456>() * bounded<123>()).unwrap() == 456 * 123);
  KJ_EXPECT((boundedValue<456>() / bounded<123>()).unwrap() == 456 / 123);
  KJ_EXPECT((boundedValue<456>() % bounded<123>()).unwrap() == 456 % 123);

  {
    Bounded<123, uint8_t> succ1 KJ_UNUSED = bounded<123>();
    Bounded<123, uint8_t> succ2 KJ_UNUSED = bounded<122>();
    Bounded<123, uint8_t> succ3 KJ_UNUSED = bounded<0>();
    // COMPILE ERROR: Bounded<123, uint8_t> err KJ_UNUSED = bounded<124>();
    // COMPILE ERROR: Bounded<123, uint8_t> err KJ_UNUSED = bounded<125>();
    // COMPILE ERROR: Bounded<123, uint8_t> err KJ_UNUSED = bounded<123456>();
  }

  Bounded<123, uint8_t> foo;
  foo = bounded<123>();
  foo = bounded<122>();
  foo = bounded<0>();
  // COMPILE ERROR: foo = bounded<124>();
  // COMPILE ERROR: foo = bounded<125>();
  // COMPILE ERROR: foo = bounded<123456>();

  Bounded<16, uint8_t> bar;
  // COMPILE ERROR: bar = foo >> bounded<2>();
  bar = foo >> bounded<3>();

  // COMPILE ERROR: foo = bar << bounded<3>();
  foo = bar << bounded<2>();
}